

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.cpp
# Opt level: O0

void __thiscall
MobileElement::MobileElement(MobileElement *this,string *name,int footprint,double speed)

{
  invalid_argument *piVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  allocator local_35 [13];
  double local_28;
  double speed_local;
  string *psStack_18;
  int footprint_local;
  string *name_local;
  MobileElement *this_local;
  
  local_28 = speed;
  speed_local._4_4_ = footprint;
  psStack_18 = name;
  name_local = (string *)this;
  std::enable_shared_from_this<MobileElement>::enable_shared_from_this
            (&this->super_enable_shared_from_this<MobileElement>);
  this->_vptr_MobileElement = (_func_int **)&PTR___cxa_pure_virtual_002aa300;
  std::__cxx11::string::string((string *)&this->name_,(string *)psStack_18);
  this->footprint_ = speed_local._4_4_;
  this->speed_ = local_28;
  this->reading_frame_ = -1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->gene_bound_,"",local_35);
  std::allocator<char>::~allocator((allocator<char> *)local_35);
  this->polymerasereadthrough_ = false;
  this->start_ = 0;
  this->stop_ = this->start_ + this->footprint_;
  if (this->footprint_ < 0) {
    local_79 = 1;
    piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(&local_78,"Mobile element \'",&this->name_);
    std::operator+(&local_58,&local_78,"\' has a negative footprint size.");
    std::invalid_argument::invalid_argument(piVar1,(string *)&local_58);
    local_79 = 0;
    __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (this->speed_ <= 0.0 && this->speed_ != 0.0) {
    piVar1 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(&local_c0,"Mobile element \'",&this->name_);
    std::operator+(&local_a0,&local_c0,"\' has a negative average speed.");
    std::invalid_argument::invalid_argument(piVar1,(string *)&local_a0);
    __cxa_throw(piVar1,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

MobileElement::MobileElement(const std::string &name, int footprint, double speed)
    : name_(name), footprint_(footprint), speed_(speed), reading_frame_(-1) {
  start_ = 0;
  stop_ = start_ + footprint_;
  if (footprint_ < 0) {
    throw std::invalid_argument("Mobile element '" + name_ +
                                "' has a negative footprint size.");
  }
  if (speed_ < 0) {
    throw std::invalid_argument("Mobile element '" + name_ +
                                "' has a negative average speed.");
  }
}